

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O0

void __thiscall
iqnet::Reactor<boost::mutex>::invoke_event_handler(Reactor<boost::mutex> *this,HandlerState *hs)

{
  uint uVar1;
  Event_handler *handler_00;
  Event_handler *handler;
  HandlerState *pHStack_18;
  bool terminate;
  HandlerState *hs_local;
  Reactor<boost::mutex> *this_local;
  
  handler._7_1_ = 0;
  pHStack_18 = hs;
  hs_local = (HandlerState *)this;
  handler_00 = find_handler(this,hs->fd);
  if (handler_00 != (Event_handler *)0x0) {
    uVar1 = (*handler_00->_vptr_Event_handler[6])();
    if ((uVar1 & 1) == 0) {
      invoke_clients_handler(this,handler_00,pHStack_18,(bool *)((long)&handler + 7));
    }
    else {
      invoke_servers_handler(this,handler_00,pHStack_18,(bool *)((long)&handler + 7));
    }
    if ((handler._7_1_ & 1) != 0) {
      (*(this->super_Reactor_base)._vptr_Reactor_base[4])(this,handler_00);
      (*handler_00->_vptr_Event_handler[5])();
    }
    return;
  }
  __assert_fail("handler",
                "/workspace/llm4binary/github/license_c_cmakelists/adedov[P]libiqxmlrpc/libiqxmlrpc/reactor_impl.h"
                ,0xd5,
                "void iqnet::Reactor<boost::mutex>::invoke_event_handler(Reactor_base::HandlerState &) [Lock = boost::mutex]"
               );
}

Assistant:

void Reactor<Lock>::invoke_event_handler( Reactor_base::HandlerState& hs )
{
  bool terminate = false;

  Event_handler* handler = find_handler(hs.fd);
  assert(handler);

  if( handler->catch_in_reactor() )
    invoke_servers_handler( handler, hs, terminate );
  else
    invoke_clients_handler( handler, hs, terminate );

  if( terminate )
  {
    unregister_handler( handler );
    handler->finish();
  }
}